

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

ssize_t __thiscall
CompressedXipReader::write(CompressedXipReader *this,int __fd,void *__buf,size_t __n)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  
  if ((this->_memrd).super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    loadmemrd(this);
  }
  peVar1 = (this->_memrd).super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar2 = (*(peVar1->super_ReadWriter)._vptr_ReadWriter[3])
                    (peVar1,CONCAT44(in_register_00000034,__fd),__buf);
  this->_pos = this->_pos + (int)__buf;
  return CONCAT44(extraout_var,iVar2);
}

Assistant:

virtual void write(const uint8_t *p, size_t n)
    {
        if (!_memrd)
            loadmemrd();

        _memrd->write(p, n);
        _pos += n;
    }